

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  int in_EDX;
  int32_t shard_index;
  char *filter;
  string f;
  bool in_stack_000000df;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  char *in_stack_ffffffffffffff48;
  int test_count;
  string local_90 [32];
  string local_70 [4];
  int32_t in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  string local_38 [56];
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(in_EDX + 1));
  }
  std::__cxx11::string::string(local_38,(string *)FLAGS_gtest_filter_abi_cxx11_);
  uVar4 = std::__cxx11::string::c_str();
  bVar1 = String::CStringEquals(in_stack_ffffffffffffff48,(char *)0x576f66);
  test_count = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  if (!bVar1) {
    ColoredPrintf(kYellow,"Note: %s filter = %s\n","Google Test",uVar4);
  }
  bVar1 = ShouldShard(in_stack_000000e8,in_stack_000000e0,in_stack_000000df);
  if (bVar1) {
    iVar2 = Int32FromEnvOrDie(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    pcVar5 = posix::GetEnv((char *)0x576ffa);
    ColoredPrintf(kYellow,"Note: This is test shard %d of %s.\n",(ulong)(iVar2 + 1),pcVar5);
  }
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    uVar3 = UnitTest::random_seed((UnitTest *)0x577037);
    ColoredPrintf(kYellow,"Note: Randomizing tests\' orders with a seed of %d .\n",(ulong)uVar3);
  }
  ColoredPrintf(kGreen,"[==========] ");
  UnitTest::test_to_run_count((UnitTest *)0x57707a);
  FormatTestCount_abi_cxx11_(test_count);
  uVar4 = std::__cxx11::string::c_str();
  UnitTest::test_suite_to_run_count((UnitTest *)0x5770ab);
  FormatTestSuiteCount_abi_cxx11_((int)((ulong)uVar4 >> 0x20));
  uVar6 = std::__cxx11::string::c_str();
  printf("Running %s from %s.\n",uVar4,uVar6);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  fflush(_stdout);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG_GET(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  std::string f = GTEST_FLAG_GET(filter);
  const char* const filter = f.c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(GTestColor::kYellow, "Note: %s filter = %s\n", GTEST_NAME_,
                  filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const int32_t shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(GTestColor::kYellow, "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG_GET(shuffle)) {
    ColoredPrintf(GTestColor::kYellow,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}